

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Asyncify.cpp
# Opt level: O0

void __thiscall
wasm::ModAsyncify<true,_false,_true>::visitCall(ModAsyncify<true,_false,_true> *this,Call *curr)

{
  bool bVar1;
  Module *this_00;
  Function *this_01;
  Function *target;
  Call *curr_local;
  ModAsyncify<true,_false,_true> *this_local;
  
  unsetUnwinding(this);
  this_00 = Walker<wasm::ModAsyncify<true,_false,_true>,_wasm::Visitor<wasm::ModAsyncify<true,_false,_true>,_void>_>
            ::getModule((Walker<wasm::ModAsyncify<true,_false,_true>,_wasm::Visitor<wasm::ModAsyncify<true,_false,_true>,_void>_>
                         *)&(this->
                            super_WalkerPass<wasm::LinearExecutionWalker<wasm::ModAsyncify<true,_false,_true>,_wasm::Visitor<wasm::ModAsyncify<true,_false,_true>,_void>_>_>
                            ).
                            super_LinearExecutionWalker<wasm::ModAsyncify<true,_false,_true>,_wasm::Visitor<wasm::ModAsyncify<true,_false,_true>,_void>_>
                       );
  this_01 = Module::getFunction(this_00,(Name)(curr->target).super_IString.str);
  bVar1 = Importable::imported(&this_01->super_Importable);
  if (bVar1) {
    this->unwinding = true;
  }
  return;
}

Assistant:

void visitCall(Call* curr) {
    unsetUnwinding();
    if (!importsAlwaysUnwind) {
      return;
    }
    auto* target = this->getModule()->getFunction(curr->target);
    if (!target->imported()) {
      return;
    }
    // This is an import that definitely unwinds. Await the next check of
    // the state in this linear execution trace, which we can turn into a
    // constant.
    this->unwinding = true;
  }